

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbutton.cpp
# Opt level: O0

void __thiscall
QtMWidgets::NavigationButton::NavigationButton
          (NavigationButton *this,Direction direction,QWidget *parent)

{
  NavigationButtonPrivate *this_00;
  NavigationButtonPrivate *this_01;
  Object local_60 [8];
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  Object local_38 [24];
  QWidget *local_20;
  QWidget *parent_local;
  NavigationButton *pNStack_10;
  Direction direction_local;
  NavigationButton *this_local;
  
  local_20 = parent;
  parent_local._4_4_ = direction;
  pNStack_10 = this;
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_00232e48;
  *(undefined ***)&this->field_0x10 = &PTR__NavigationButton_00233010;
  this_00 = (NavigationButtonPrivate *)operator_new(0x40);
  NavigationButtonPrivate::NavigationButtonPrivate(this_00,this,parent_local._4_4_);
  QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::NavigationButtonPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationButtonPrivate>_>
            ::operator->(&this->d);
  NavigationButtonPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  local_48 = QAbstractButton::pressed;
  local_40 = 0;
  local_58 = _q_pressed;
  uStack_50 = 0;
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_38,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::pressed,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::NavigationButton::*)()>
            (local_60,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::released,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

NavigationButton::NavigationButton( Direction direction, QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new NavigationButtonPrivate( this, direction ) )
{
	d->init();

	connect( this, &QAbstractButton::pressed,
		this, &NavigationButton::_q_pressed );
	connect( this, &QAbstractButton::released,
		this, &NavigationButton::_q_released );
}